

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

void __thiscall curlpp::HttpPost::HttpPost(HttpPost *this,Forms *posts)

{
  Forms *this_00;
  size_t *psVar1;
  _Node *p_Var2;
  FormPart *pFVar3;
  _List_node_base *p_Var4;
  
  this_00 = &this->mForms;
  this->mFirst = (curl_httppost *)0x0;
  this->mLast = (curl_httppost *)0x0;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var4 = (_List_node_base *)posts;
  while (p_Var4 = (((_List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)posts) {
    p_Var2 = std::__cxx11::
             list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
             ::_M_create_node<utilspp::clone_ptr<curlpp::FormPart>const&>
                       ((list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
                         *)this_00,(clone_ptr<curlpp::FormPart> *)(p_Var4 + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this->mForms).
              super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pFVar3 = utilspp::clone_ptr<curlpp::FormPart>::operator->
                       ((clone_ptr<curlpp::FormPart> *)
                        ((this->mForms).
                         super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1));
    (*pFVar3->_vptr_FormPart[3])(pFVar3,this,&this->mLast);
  }
  return;
}

Assistant:

curlpp::HttpPost::HttpPost(const Forms & posts)
  : mFirst(NULL)
  , mLast(NULL)
{
  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 
}